

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int XML_SetHashSalt(XML_Parser parser,unsigned_long hash_salt)

{
  XML_Parser pXVar1;
  
  do {
    pXVar1 = parser;
    if (pXVar1 == (XML_Parser)0x0) {
      return 0;
    }
    parser = pXVar1->m_parentParser;
  } while (pXVar1->m_parentParser != (XML_Parser)0x0);
  if (((pXVar1->m_parsingStatus).parsing | XML_FINISHED) == XML_SUSPENDED) {
    return 0;
  }
  pXVar1->m_hash_secret_salt = hash_salt;
  return 1;
}

Assistant:

int XMLCALL
XML_SetHashSalt(XML_Parser parser,
                unsigned long hash_salt)
{
  if (parser == NULL)
    return 0;
  if (parser->m_parentParser)
    return XML_SetHashSalt(parser->m_parentParser, hash_salt);
  /* block after XML_Parse()/XML_ParseBuffer() has been called */
  if (ps_parsing == XML_PARSING || ps_parsing == XML_SUSPENDED)
    return 0;
  hash_secret_salt = hash_salt;
  return 1;
}